

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O2

void DwaCompressor_destroy(DwaCompressor *me)

{
  void *ptr;
  int i_1;
  long lVar1;
  int c;
  long lVar2;
  ulong uVar3;
  
  if (me->_packedAcBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_packedAcBuffer);
  }
  if (me->_packedDcBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_packedDcBuffer);
  }
  if (me->_rleBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_rleBuffer);
  }
  if (me->_channelData != (ChannelData *)0x0) {
    lVar1 = 0x1a0;
    for (lVar2 = 0; lVar2 < me->_numChannels; lVar2 = lVar2 + 1) {
      ptr = *(void **)((long)(me->_channelData->_dctData)._dctData + lVar1 + -0x20);
      if (ptr != (void *)0x0) {
        internal_exr_free(ptr);
      }
      lVar1 = lVar1 + 0x240;
    }
    internal_exr_free(me->_channelData);
  }
  if (me->_cscChannelSets != (CscChannelSet *)0x0) {
    internal_exr_free(me->_cscChannelSets);
  }
  if (me->_channelRules != sDefaultChannelRules && me->_channelRules != sLegacyChannelRules) {
    lVar1 = 0;
    for (uVar3 = 0; uVar3 < me->_channelRuleCount; uVar3 = uVar3 + 1) {
      Classifier_destroy((Classifier *)((long)&me->_channelRules->_suffix + lVar1));
      lVar1 = lVar1 + 0x18;
    }
    internal_exr_free(me->_channelRules);
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    if (me->_planarUncBuffer[lVar1] != (uint8_t *)0x0) {
      internal_exr_free(me->_planarUncBuffer[lVar1]);
    }
  }
  return;
}

Assistant:

static void
DwaCompressor_destroy (DwaCompressor* me)
{
    if (me->_packedAcBuffer) internal_exr_free (me->_packedAcBuffer);
    if (me->_packedDcBuffer) internal_exr_free (me->_packedDcBuffer);
    if (me->_rleBuffer) internal_exr_free (me->_rleBuffer);

    if (me->_channelData)
    {
        for (int c = 0; c < me->_numChannels; ++c)
            DctCoderChannelData_destroy (&(me->_channelData[c]._dctData));

        internal_exr_free (me->_channelData);
    }

    if (me->_cscChannelSets) internal_exr_free (me->_cscChannelSets);
    if (me->_channelRules != sLegacyChannelRules &&
        me->_channelRules != sDefaultChannelRules)
    {
        for (size_t i = 0; i < me->_channelRuleCount; ++i)
            Classifier_destroy (&(me->_channelRules[i]));
        internal_exr_free (me->_channelRules);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (me->_planarUncBuffer[i])
            internal_exr_free (me->_planarUncBuffer[i]);
    }
}